

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_init_do(Curl_easy *data,connectdata *conn)

{
  undefined1 *puVar1;
  ushort uVar2;
  Curl_HttpReq CVar3;
  ushort uVar4;
  curltime cVar5;
  
  if (conn == (connectdata *)0x0) {
    uVar4 = *(ushort *)&(data->state).field_0x4e4;
  }
  else {
    puVar1 = &(conn->bits).field_0x5;
    *puVar1 = *puVar1 & 0xf7;
    uVar2 = *(ushort *)&(data->state).field_0x4e4;
    uVar4 = uVar2;
    if (((char)uVar2 < '\0') && (uVar4 = uVar2 & 0xff7f, (conn->handler->flags & 0x1000) != 0)) {
      uVar4 = uVar2;
    }
  }
  *(ushort *)&(data->state).field_0x4e4 = uVar4 & 0xf6ff;
  if (((data->set).field_0x87b & 0x10) == 0) {
    if ((data->set).httpreq != HTTPREQ_HEAD) goto LAB_003f1d9d;
    CVar3 = HTTPREQ_GET;
  }
  else {
    CVar3 = HTTPREQ_HEAD;
  }
  (data->set).httpreq = CVar3;
LAB_003f1d9d:
  cVar5 = Curl_now();
  (data->req).start.tv_sec = cVar5.tv_sec;
  (data->req).start.tv_usec = cVar5.tv_usec;
  (data->req).now.tv_sec = (data->req).start.tv_sec;
  (data->req).now.tv_usec = (data->req).start.tv_usec;
  *(undefined4 *)&(data->req).now.field_0xc = *(undefined4 *)&(data->req).start.field_0xc;
  (data->req).bytecount = 0;
  (data->req).buf = (data->state).buffer;
  (data->req).hbufp = (data->state).headerbuff;
  *(ushort *)&(data->req).field_0x570 =
       ((ushort)*(undefined4 *)&(data->req).field_0x570 & 0xfff6) + 1;
  Curl_speedinit(data);
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_init_do(struct Curl_easy *data, struct connectdata *conn)
{
  struct SingleRequest *k = &data->req;

  if(conn) {
    conn->bits.do_more = FALSE; /* by default there's no curl_do_more() to
                                   use */
    /* if the protocol used doesn't support wildcards, switch it off */
    if(data->state.wildcardmatch &&
       !(conn->handler->flags & PROTOPT_WILDCARD))
      data->state.wildcardmatch = FALSE;
  }

  data->state.done = FALSE; /* *_done() is not called yet */
  data->state.expect100header = FALSE;


  if(data->set.opt_no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->set.httpreq = HTTPREQ_HEAD;
  else if(HTTPREQ_HEAD == data->set.httpreq)
    /* ... but if unset there really is no perfect method that is the
       "opposite" of HEAD but in reality most people probably think GET
       then. The important thing is that we can't let it remain HEAD if the
       opt_no_body is set FALSE since then we'll behave wrong when getting
       HTTP. */
    data->set.httpreq = HTTPREQ_GET;

  k->start = Curl_now(); /* start time */
  k->now = k->start;   /* current time is now */
  k->header = TRUE; /* assume header */

  k->bytecount = 0;

  k->buf = data->state.buffer;
  k->hbufp = data->state.headerbuff;
  k->ignorebody = FALSE;

  Curl_speedinit(data);

  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);

  return CURLE_OK;
}